

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

void google::protobuf::internal::WireFormat::SerializeUnknownFields
               (UnknownFieldSet *unknown_fields,CodedOutputStream *output)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  pointer data;
  int iVar2;
  uint32 value;
  UnknownField *this;
  UnknownFieldSet *unknown_fields_00;
  uint64 uVar3;
  string *psVar4;
  int i;
  int index;
  
  index = 0;
  while( true ) {
    pvVar1 = unknown_fields->fields_;
    iVar2 = 0;
    if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      iVar2 = (int)((ulong)((long)(pvVar1->
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar1->
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (iVar2 <= index) break;
    this = UnknownFieldSet::field(unknown_fields,index);
    switch(this->type_) {
    case 0:
      io::CodedOutputStream::WriteVarint32(output,this->number_ << 3);
      uVar3 = UnknownField::varint(this);
      io::CodedOutputStream::WriteVarint64(output,uVar3);
      break;
    case 1:
      io::CodedOutputStream::WriteVarint32(output,this->number_ * 8 + 5);
      value = UnknownField::fixed32(this);
      io::CodedOutputStream::WriteLittleEndian32(output,value);
      break;
    case 2:
      io::CodedOutputStream::WriteVarint32(output,this->number_ * 8 + 1);
      uVar3 = UnknownField::fixed64(this);
      io::CodedOutputStream::WriteLittleEndian64(output,uVar3);
      break;
    case 3:
      io::CodedOutputStream::WriteVarint32(output,this->number_ * 8 + 2);
      psVar4 = UnknownField::length_delimited_abi_cxx11_(this);
      io::CodedOutputStream::WriteVarint32(output,(uint32)psVar4->_M_string_length);
      psVar4 = UnknownField::length_delimited_abi_cxx11_(this);
      data = (psVar4->_M_dataplus)._M_p;
      psVar4 = UnknownField::length_delimited_abi_cxx11_(this);
      io::CodedOutputStream::WriteRawMaybeAliased(output,data,(int)psVar4->_M_string_length);
      break;
    case 4:
      io::CodedOutputStream::WriteVarint32(output,this->number_ * 8 + 3);
      unknown_fields_00 = UnknownField::group(this);
      SerializeUnknownFields(unknown_fields_00,output);
      io::CodedOutputStream::WriteVarint32(output,this->number_ * 8 + 4);
    }
    index = index + 1;
  }
  return;
}

Assistant:

void WireFormat::SerializeUnknownFields(const UnknownFieldSet& unknown_fields,
                                        io::CodedOutputStream* output) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_VARINT));
        output->WriteVarint64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED32));
        output->WriteLittleEndian32(field.fixed32());
        break;
      case UnknownField::TYPE_FIXED64:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED64));
        output->WriteLittleEndian64(field.fixed64());
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        output->WriteVarint32(field.length_delimited().size());
        output->WriteRawMaybeAliased(field.length_delimited().data(),
                                     field.length_delimited().size());
        break;
      case UnknownField::TYPE_GROUP:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_START_GROUP));
        SerializeUnknownFields(field.group(), output);
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }
}